

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O1

void CHECK(int t,int st,int got,int expect,int pc,char *desc)

{
  if ((((100.0 - (double)pc) * (double)expect) / 100.0 <= (double)got) &&
     ((double)got <= (((double)pc + 100.0) * (double)expect) / 100.0)) {
    printf("TEST %2d.%-2d PASS (%s: %d)\n",t,st,desc,(ulong)(uint)expect);
    return;
  }
  fprintf(_stderr,"TEST %2d.%-2d FAILED got %d (%s: %d)\n",t,st,got,desc,(ulong)(uint)expect);
  return;
}

Assistant:

void CHECK(int t, int st, int got, int expect, int pc, char *desc)
{
   if ((got >= (((1E2-pc)*expect)/1E2)) && (got <= (((1E2+pc)*expect)/1E2)))
   {
      printf("TEST %2d.%-2d PASS (%s: %d)\n", t, st, desc, expect);
   }
   else
   {
      fprintf(stderr,
              "TEST %2d.%-2d FAILED got %d (%s: %d)\n",
              t, st, got, desc, expect);
   }
}